

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

void ot::commissioner::CommissionerSafe::Invoke(int param_1,short param_2,void *aContext)

{
  AsyncRequest asyncReq;
  _Any_data _Stack_28;
  code *local_18;
  code *local_10;
  
  if (aContext != (void *)0x0) {
    PopAsyncRequest((AsyncRequest *)&_Stack_28,(CommissionerSafe *)aContext);
    if (local_18 != (code *)0x0) {
      (*local_10)(&_Stack_28);
      if (local_18 != (code *)0x0) {
        (*local_18)(&_Stack_28,&_Stack_28,__destroy_functor);
      }
    }
    return;
  }
  abort();
}

Assistant:

void CommissionerSafe::Invoke(evutil_socket_t, short, void *aContext)
{
    auto commissionerSafe = reinterpret_cast<CommissionerSafe *>(aContext);

    VerifyOrDie(commissionerSafe != nullptr);

    if (auto asyncReq = commissionerSafe->PopAsyncRequest())
    {
        asyncReq();
    }
}